

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANMS.cpp
# Opt level: O1

void ANMS(vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *keyPoint,
         vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pKVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pKVar7;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *__range1;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float response;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> r;
  vector<float,_std::allocator<float>_> robustResponse;
  float local_a4;
  KeyPoint local_94;
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> local_78;
  vector<float,_std::allocator<float>_> local_58;
  vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *local_40;
  pointer local_38;
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (KeyPoint *)0x0;
  local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (KeyPoint *)0x0;
  pKVar7 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  fVar9 = 0.0;
  local_40 = (vector<cv::KeyPoint,std::allocator<cv::KeyPoint>> *)corners;
  if (pKVar7 != pKVar4) {
    local_a4 = 0.0;
    do {
      fVar9 = pKVar7->response;
      local_94.pt.x = fVar9 * 0.9;
      if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,(float *)&local_94);
      }
      else {
        *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_94.pt.x;
        local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (fVar9 <= local_a4) {
        fVar9 = local_a4;
      }
      pKVar7 = pKVar7 + 1;
      local_a4 = fVar9;
    } while (pKVar7 != pKVar4);
    fVar9 = fVar9 * 0.9;
  }
  pKVar7 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pKVar7 != pKVar4) {
    local_38 = pKVar4;
    do {
      fVar1 = (pKVar7->pt).x;
      fVar2 = (pKVar7->pt).y;
      fVar3 = pKVar7->response;
      if (fVar3 <= fVar9) {
        pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        fVar11 = 3.4028235e+38;
        if ((keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
            super__Vector_impl_data._M_finish != pKVar4) {
          lVar8 = 1;
          uVar6 = 0;
          fVar12 = 3.4028235e+38;
          do {
            fVar11 = fVar12;
            if (fVar3 < local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6]) {
              fVar11 = *(float *)((long)pKVar4 + lVar8 * 4 + -4) - fVar1;
              fVar10 = (&(pKVar4->pt).x)[lVar8] - fVar2;
              fVar11 = fVar11 * fVar11 + fVar10 * fVar10;
              if (fVar11 < 0.0) {
                fVar11 = sqrtf(fVar11);
              }
              else {
                fVar11 = SQRT(fVar11);
              }
              if (fVar12 <= fVar11) {
                fVar11 = fVar12;
              }
            }
            uVar6 = uVar6 + 1;
            pKVar4 = (keyPoint->super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar5 = ((long)(keyPoint->
                           super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pKVar4 >> 2) *
                    0x6db6db6db6db6db7;
            lVar8 = lVar8 + 7;
            fVar12 = fVar11;
          } while (uVar6 <= uVar5 && uVar5 - uVar6 != 0);
        }
        local_94.size = 3.0;
        local_94.angle = -1.0;
        local_94.octave = 0;
        local_94.class_id = -1;
        local_94.pt.x = fVar1;
        local_94.pt.y = fVar2;
        local_94.response = fVar11;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (&local_78,&local_94);
        pKVar4 = local_38;
      }
      else {
        local_94.size = 3.0;
        local_94.angle = -1.0;
        local_94.response = 3.4028235e+38;
        local_94.octave = 0;
        local_94.class_id = -1;
        local_94.pt.x = fVar1;
        local_94.pt.y = fVar2;
        std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::emplace_back<cv::KeyPoint>
                  (&local_78,&local_94);
      }
      pKVar7 = pKVar7 + 1;
    } while (pKVar7 != pKVar4);
  }
  pKVar4 = local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pKVar7 = local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar6 = ((long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
    lVar8 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>>
              ((__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_start,
               (__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                 super__Vector_impl_data._M_finish,(ulong)(((uint)lVar8 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_cv::KeyPoint_&,_const_cv::KeyPoint_&)>)0x1039c9);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(cv::KeyPoint_const&,cv::KeyPoint_const&)>>
              ((__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                )pKVar7,(__normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                         )pKVar4,
               (_Iter_comp_iter<bool_(*)(const_cv::KeyPoint_&,_const_cv::KeyPoint_&)>)0x1039c9);
  }
  if ((ulong)(((long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7) < 0x1f5) {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>>
              (local_40,*(undefined8 *)local_40);
  }
  else {
    std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<cv::KeyPoint*,std::vector<cv::KeyPoint,std::allocator<cv::KeyPoint>>>>
              (local_40,*(undefined8 *)local_40,
               local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
               super__Vector_impl_data._M_start + 499);
  }
  if (local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
      super__Vector_impl_data._M_start != (KeyPoint *)0x0) {
    operator_delete(local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ANMS(std::vector<KeyPoint>& keyPoint, std::vector<KeyPoint>& corners) {
	const int n = 500;
	const float robustC = 0.9F;

	vector<float> robustResponse;
	vector<KeyPoint> r;


	float globalMax = 0.0F;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		robustResponse.push_back(response*robustC);
		if (response > globalMax) {
			globalMax = response;
		}
	}

	globalMax *= robustC;

	for (KeyPoint point : keyPoint) {
		float response = point.response;
		if (response > globalMax) {
			r.push_back(KeyPoint(point.pt, 3, -1.0F, numeric_limits<float>::max()));
		}
		else {
			float minDist = numeric_limits<float>::max();
			for (int i = 0; i < keyPoint.size(); ++i) {
				float resP = robustResponse[i];
				if (resP > response) {
					float dist = getDistance(keyPoint[i], point);
					if (dist < minDist) {
						minDist = dist;
					}
				}
			}
			r.push_back(KeyPoint(point.pt, 3, -1.0F, minDist));
		}
	}

	sort(r.begin(), r.end(), compDist);
	if (r.size() > n) {
		corners.insert(corners.begin(), r.begin(), r.begin() + n - 1);
	}
	else {
		corners.insert(corners.begin(), r.begin(), r.end());
	}

}